

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_reader.cpp
# Opt level: O2

unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true> __thiscall
duckdb::ParquetReader::ReadStatistics(ParquetReader *this,string *name)

{
  unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true> __p_00;
  __type _Var1;
  ulong uVar2;
  reference __lhs;
  FileMetaData *pFVar3;
  pointer pPVar4;
  ParquetReader *reader;
  pointer this_00;
  type other;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  ulong __n;
  vector<duckdb_parquet::ColumnChunk,_true> *columns;
  pointer __p;
  unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true> column_stats
  ;
  _func_int **local_50;
  unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true> chunk_stats;
  
  for (__n = 0; uVar2 = (long)(name[2]._M_string_length - (long)name[2]._M_dataplus._M_p) / 0x98,
      __n < uVar2; __n = __n + 1) {
    __lhs = vector<duckdb::MultiFileColumnDefinition,_true>::get<true>
                      ((vector<duckdb::MultiFileColumnDefinition,_true> *)(name + 2),__n);
    _Var1 = ::std::operator==(&__lhs->name,in_RDX);
    if (_Var1) {
      uVar2 = (long)(name[2]._M_string_length - (long)name[2]._M_dataplus._M_p) / 0x98;
      break;
    }
  }
  if (uVar2 == __n) {
    (this->super_BaseFileReader)._vptr_BaseFileReader = (_func_int **)0x0;
  }
  else {
    column_stats.
    super_unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>._M_t.
    super___uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>._M_t
    .super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>.
    super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl =
         (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)
         (__uniq_ptr_data<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true,_true>
          )0x0;
    pFVar3 = GetFileMetadata((ParquetReader *)name);
    pPVar4 = unique_ptr<duckdb::ParquetColumnSchema,_std::default_delete<duckdb::ParquetColumnSchema>,_true>
             ::operator->((unique_ptr<duckdb::ParquetColumnSchema,_std::default_delete<duckdb::ParquetColumnSchema>,_true>
                           *)&name[0xb].field_2._M_allocated_capacity);
    reader = (ParquetReader *)
             vector<duckdb::ParquetColumnSchema,_true>::get<true>(&pPVar4->children,__n);
    local_50 = (this->super_BaseFileReader)._vptr_BaseFileReader;
    columns = (vector<duckdb_parquet::ColumnChunk,_true> *)0x0;
    do {
      if ((vector<duckdb_parquet::ColumnChunk,_true> *)
          (((long)(pFVar3->row_groups).
                  super_vector<duckdb_parquet::RowGroup,_std::allocator<duckdb_parquet::RowGroup>_>.
                  super__Vector_base<duckdb_parquet::RowGroup,_std::allocator<duckdb_parquet::RowGroup>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
           (long)(pFVar3->row_groups).
                 super_vector<duckdb_parquet::RowGroup,_std::allocator<duckdb_parquet::RowGroup>_>.
                 super__Vector_base<duckdb_parquet::RowGroup,_std::allocator<duckdb_parquet::RowGroup>_>
                 ._M_impl.super__Vector_impl_data._M_start) / 0x60) <= columns) {
        (this->super_BaseFileReader)._vptr_BaseFileReader =
             (_func_int **)
             column_stats.
             super_unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>.
             _M_t.
             super___uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>
             .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl;
        column_stats.
        super_unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>._M_t.
        super___uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>.
        _M_t.
        super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>
        .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl =
             (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)
             (__uniq_ptr_data<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true,_true>
              )0x0;
        goto LAB_00d8d0c0;
      }
      vector<duckdb_parquet::RowGroup,_true>::get<true>(&pFVar3->row_groups,(size_type)columns);
      ParquetColumnSchema::Stats((ParquetColumnSchema *)&chunk_stats,reader,(idx_t)name,columns);
      __p_00 = chunk_stats;
      if (chunk_stats.
          super_unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>.
          _M_t.
          super___uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>
          .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl ==
          (__uniq_ptr_data<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true,_true>
           )0x0) {
        local_50 = (_func_int **)0x0;
      }
      else if (column_stats.
               super_unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
               ._M_t.
               super___uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>
               .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl ==
               (__uniq_ptr_data<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true,_true>
                )0x0) {
        chunk_stats.
        super_unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>._M_t.
        super___uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>.
        _M_t.
        super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>
        .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl =
             (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)
             (__uniq_ptr_data<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true,_true>
              )0x0;
        ::std::__uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
        ::reset((__uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
                 *)&column_stats,
                (pointer)__p_00.
                         super_unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
                         ._M_t.
                         super___uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>
                         .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl);
      }
      else {
        this_00 = unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                  ::operator->(&column_stats);
        other = unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                ::operator*(&chunk_stats);
        BaseStatistics::Merge(this_00,other);
      }
      ::std::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>::
      ~unique_ptr((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
                   *)&chunk_stats);
      columns = (vector<duckdb_parquet::ColumnChunk,_true> *)
                ((long)&(columns->
                        super_vector<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
                        ).
                        super__Vector_base<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
                        ._M_impl.super__Vector_impl_data._M_start + 1);
    } while (__p_00.
             super_unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>.
             _M_t.
             super___uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>
             .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl !=
             (__uniq_ptr_data<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true,_true>
              )0x0);
    (this->super_BaseFileReader)._vptr_BaseFileReader = local_50;
LAB_00d8d0c0:
    ::std::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>::
    ~unique_ptr(&column_stats.
                 super_unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
               );
  }
  return (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>)this
  ;
}

Assistant:

unique_ptr<BaseStatistics> ParquetReader::ReadStatistics(const string &name) {
	idx_t file_col_idx;
	for (file_col_idx = 0; file_col_idx < columns.size(); file_col_idx++) {
		if (columns[file_col_idx].name == name) {
			break;
		}
	}
	if (file_col_idx == columns.size()) {
		return nullptr;
	}

	unique_ptr<BaseStatistics> column_stats;
	auto file_meta_data = GetFileMetadata();
	auto &column_schema = root_schema->children[file_col_idx];

	for (idx_t row_group_idx = 0; row_group_idx < file_meta_data->row_groups.size(); row_group_idx++) {
		auto &row_group = file_meta_data->row_groups[row_group_idx];
		auto chunk_stats = column_schema.Stats(*this, row_group_idx, row_group.columns);
		if (!chunk_stats) {
			return nullptr;
		}
		if (!column_stats) {
			column_stats = std::move(chunk_stats);
		} else {
			column_stats->Merge(*chunk_stats);
		}
	}
	return column_stats;
}